

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwapByteOrder.h
# Opt level: O0

uint16_t llvm::sys::SwapByteOrder_16(uint16_t value)

{
  uint16_t Lo;
  uint16_t Hi;
  uint16_t value_local;
  
  return value << 8 | value >> 8;
}

Assistant:

inline uint16_t SwapByteOrder_16(uint16_t value) {
#if defined(_MSC_VER) && !defined(_DEBUG)
  // The DLL version of the runtime lacks these functions (bug!?), but in a
  // release build they're replaced with BSWAP instructions anyway.
  return _byteswap_ushort(value);
#else
  uint16_t Hi = value << 8;
  uint16_t Lo = value >> 8;
  return Hi | Lo;
#endif
}